

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O0

void str_gen(char *s,int len)

{
  size_t n_ch;
  int i;
  int len_local;
  char *s_local;
  
  i = 0;
  if (0 < len) {
    for (; i < len; i = i + 1) {
      s[i] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[(ulong)(long)i % 0x3e]
      ;
    }
    s[len + -1] = '\0';
  }
  return;
}

Assistant:

void str_gen(char *s, const int len) {

    int i = 0;
    static const char alphanum[] =
        "0123456789"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz";
    size_t n_ch = strlen(alphanum);

    if (len < 1){
        return;
    }

    // return same ordering of chars
    while (i < len) {
        s[i] = alphanum[i%n_ch];
        i++;
    }
    s[len-1] = '\0';
}